

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

void __thiscall tcmalloc::ThreadCache::~ThreadCache(ThreadCache *this)

{
  uint32_t N;
  ulong uVar1;
  ThreadCache *src;
  
  if (DAT_00164b10 != 0) {
    uVar1 = 0;
    src = this;
    do {
      N = src->list_[0].length_;
      if (N != 0) {
        ReleaseToCentralCache(this,src->list_,(uint32_t)uVar1,N);
      }
      uVar1 = uVar1 + 1;
      src = (ThreadCache *)(src->list_ + 1);
    } while (uVar1 < DAT_00164b10);
  }
  return;
}

Assistant:

ThreadCache::~ThreadCache() {
  // Put unused memory back into central cache
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    if (list_[cl].length() > 0) {
      ReleaseToCentralCache(&list_[cl], cl, list_[cl].length());
    }
  }
}